

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

char * prev_path_ele(char *start,char *p,size_t *ele_len)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  char *endp;
  char *dotdot;
  int cancel;
  char *local_30;
  int local_24;
  char *local_18;
  char *local_8;
  
  local_24 = 0;
  local_30 = (char *)0x0;
  local_18 = in_RSI;
  if (in_RSI == in_RDI) {
    local_8 = (char *)0x0;
  }
  else {
    while (local_18 != in_RDI) {
      while( true ) {
        pcVar1 = local_18;
        bVar4 = false;
        if (((local_18 != in_RDI) && (bVar4 = true, local_18[-1] != '/')) &&
           (bVar4 = false, local_18[-1] != '\0')) {
          pcVar3 = strchr("",(int)local_18[-1]);
          bVar4 = pcVar3 != (char *)0x0;
        }
        if (!bVar4) break;
        local_18 = local_18 + -1;
      }
      if (local_18 == in_RDI) {
        *in_RDX = 0;
        return local_18;
      }
      while( true ) {
        bVar4 = false;
        if (local_18 != in_RDI) {
          bVar4 = true;
          if ((local_18[-1] != '/') && (bVar4 = false, local_18[-1] != '\0')) {
            pcVar3 = strchr("",(int)local_18[-1]);
            bVar4 = pcVar3 != (char *)0x0;
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        if (!bVar4) break;
        local_18 = local_18 + -1;
      }
      if (((long)pcVar1 - (long)local_18 != 1) || (*local_18 != '.')) {
        if (((long)pcVar1 - (long)local_18 == 2) && ((*local_18 == '.' && (local_18[1] == '.')))) {
          local_24 = local_24 + 1;
          if (local_30 == (char *)0x0) {
            local_30 = local_18;
          }
        }
        else {
          if (local_24 == 0) {
            *in_RDX = (long)pcVar1 - (long)local_18;
            return local_18;
          }
          local_24 = local_24 + -1;
          if (local_24 == 0) {
            local_30 = (char *)0x0;
          }
        }
      }
    }
    iVar2 = 0;
    if (local_30 != (char *)0x0) {
      iVar2 = 2;
    }
    *in_RDX = (long)iVar2;
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

static const char *prev_path_ele(const char *start, const char *p,
                                 size_t *ele_len)
{
    int cancel = 0;
    const char *dotdot = 0;

    /* if we're at the start of the string, there are no more elements */
    if (p == start)
        return 0;

    /* keep going until we find a suitable element */
    for (;;)
    {
        const char *endp;

        /*
         *   If we've reached the start of the string, it means that we have
         *   ".."'s that canceled out every earlier element of the string.
         *   If the cancel count is non-zero, it means that we have one or
         *   more ".."'s that are significant (in that they cancel out
         *   relative elements before the start of the string).  If the
         *   cancel count is zero, it means that we've exactly canceled out
         *   all remaining elements in the string.
         */
        if (p == start)
        {
            *ele_len = (dotdot != 0 ? 2 : 0);
            return dotdot;
        }
        
        /* 
         *   back up through any adjacent path separators before the current
         *   element, so that we're pointing to the first separator after the
         *   previous element
         */
        for ( ; p != start && ispathchar(*(p-1)) ; --p) ;

        /*
         *   If we're at the start of the string, this is an absolute path.
         *   Treat it specially by returning a zero-length initial element. 
         */
        if (p == start)
        {
            *ele_len = 0;
            return p;
        }

        /* note where the current element ends */
        endp = p;

        /* now back up to the path separator before this element */
        for ( ; p != start && !ispathchar(*(p-1)) ; --p) ;

        /* 
         *   if this is ".", skip it, since this simply means that this
         *   element matches the same folder as the previous element 
         */
        if (endp - p == 1 && p[0] == '.')
            continue;

        /* 
         *   if this is "..", it cancels out the preceding non-relative
         *   element; up the cancel count and keep searching 
         */
        if (endp - p == 2 && p[0] == '.' && p[1] == '.')
        {
            /* up the cancel count */
            ++cancel;

            /* if this is the first ".." we've encountered, note it */
            if (dotdot == 0)
                dotdot = p;

            /* keep searching */
            continue;
        }

        /*
         *   This is an ordinary path element, not a relative "." or ".."
         *   link.  If we have a non-zero cancel count, we're still working
         *   on canceling out elements from ".."'s we found later in the
         *   string.
         */
        if (cancel != 0)
        {
            /* this absorbs one level of cancellation */
            --cancel;

            /* 
             *   if that's the last cancellation, we've absorbed all ".."
             *   effects, so the last ".." we found is no longer significant 
             */
            if (cancel == 0)
                dotdot = 0;

            /* keep searching */
            continue;
        }

        /* this item isn't canceled out by a "..", so it's our winner */
        *ele_len = endp - p;
        return p;
    }
}